

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O2

void __thiscall
cmOSXBundleGenerator::CreateAppBundle
          (cmOSXBundleGenerator *this,string *targetName,string *outpath,string *config)

{
  bool bVar1;
  string plist;
  string out;
  string local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  bVar1 = MustSkip(this);
  if (!bVar1) {
    local_60.View_._M_str = (outpath->_M_dataplus)._M_p;
    local_60.View_._M_len = outpath->_M_string_length;
    local_90.View_._M_len = 1;
    local_90.Digits_[0] = '/';
    local_90.View_._M_str = local_90.Digits_;
    cmGeneratorTarget::GetAppBundleDirectory(&plist,this->GT,config,FullLevel);
    cmStrCat<std::__cxx11::string>(&out,&local_60,&local_90,&plist);
    std::__cxx11::string::~string((string *)&plist);
    cmsys::SystemTools::MakeDirectory(&out,(mode_t *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&out);
    local_60.View_._M_str = (outpath->_M_dataplus)._M_p;
    local_60.View_._M_len = outpath->_M_string_length;
    local_90.View_._M_len = 1;
    local_90.Digits_[0] = '/';
    local_90.View_._M_str = local_90.Digits_;
    cmGeneratorTarget::GetAppBundleDirectory(&local_b0,this->GT,config,ContentLevel);
    cmStrCat<std::__cxx11::string,char[12]>
              (&plist,&local_60,&local_90,&local_b0,(char (*) [12])"/Info.plist");
    std::__cxx11::string::~string((string *)&local_b0);
    cmLocalGenerator::GenerateAppleInfoPList(this->LocalGenerator,this->GT,targetName,&plist);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&plist);
    std::__cxx11::string::_M_assign((string *)outpath);
    std::__cxx11::string::~string((string *)&plist);
    std::__cxx11::string::~string((string *)&out);
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateAppBundle(const std::string& targetName,
                                           std::string& outpath,
                                           const std::string& config)
{
  if (this->MustSkip()) {
    return;
  }

  // Compute bundle directory names.
  std::string out = cmStrCat(
    outpath, '/',
    this->GT->GetAppBundleDirectory(config, cmGeneratorTarget::FullLevel));
  cmSystemTools::MakeDirectory(out);
  this->Makefile->AddCMakeOutputFile(out);

  // Configure the Info.plist file.  Note that it needs the executable name
  // to be set.
  std::string plist = cmStrCat(
    outpath, '/',
    this->GT->GetAppBundleDirectory(config, cmGeneratorTarget::ContentLevel),
    "/Info.plist");
  this->LocalGenerator->GenerateAppleInfoPList(this->GT, targetName, plist);
  this->Makefile->AddCMakeOutputFile(plist);
  outpath = out;
}